

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O0

FT_Fixed * ft_var_readpackeddeltas(FT_Stream stream,FT_ULong size,FT_UInt delta_cnt)

{
  byte bVar1;
  FT_Byte FVar2;
  FT_UInt16 FVar3;
  int local_54;
  FT_Memory pFStack_50;
  FT_Error error;
  FT_Memory memory;
  uint local_40;
  FT_UInt bytes_used;
  FT_UInt j;
  FT_UInt i;
  FT_UInt cnt;
  FT_UInt runcnt;
  FT_Fixed *deltas;
  FT_ULong FStack_20;
  FT_UInt delta_cnt_local;
  FT_ULong size_local;
  FT_Stream stream_local;
  
  _cnt = (FT_Fixed *)0x0;
  pFStack_50 = stream->memory;
  deltas._4_4_ = delta_cnt;
  FStack_20 = size;
  size_local = (FT_ULong)stream;
  _cnt = (FT_Fixed *)ft_mem_qrealloc(pFStack_50,8,0,(ulong)delta_cnt,(void *)0x0,&local_54);
  if (local_54 == 0) {
    bytes_used = 0;
    memory._4_4_ = 0;
    do {
      if (deltas._4_4_ <= bytes_used || FStack_20 <= memory._4_4_) {
        if (deltas._4_4_ <= bytes_used) {
          return _cnt;
        }
        break;
      }
      bVar1 = FT_Stream_GetByte((FT_Stream)size_local);
      i = (FT_UInt)bVar1;
      j = i & 0x3f;
      memory._4_4_ = memory._4_4_ + 1;
      if ((bVar1 & 0x80) == 0) {
        if ((bVar1 & 0x40) == 0) {
          memory._4_4_ = j + 1 + memory._4_4_;
          if (FStack_20 < memory._4_4_) break;
          for (local_40 = 0; local_40 <= j && bytes_used < deltas._4_4_; local_40 = local_40 + 1) {
            FVar2 = FT_Stream_GetByte((FT_Stream)size_local);
            _cnt[bytes_used] = (long)(char)FVar2 << 0x10;
            bytes_used = bytes_used + 1;
          }
        }
        else {
          memory._4_4_ = (j + 1) * 2 + memory._4_4_;
          if (FStack_20 < memory._4_4_) break;
          for (local_40 = 0; local_40 <= j && bytes_used < deltas._4_4_; local_40 = local_40 + 1) {
            FVar3 = FT_Stream_GetUShort((FT_Stream)size_local);
            _cnt[bytes_used] = (long)(short)FVar3 << 0x10;
            bytes_used = bytes_used + 1;
          }
        }
      }
      else {
        for (local_40 = 0; local_40 <= j && bytes_used < deltas._4_4_; local_40 = local_40 + 1) {
          _cnt[bytes_used] = 0;
          bytes_used = bytes_used + 1;
        }
      }
    } while (j < local_40);
    ft_mem_free(pFStack_50,_cnt);
  }
  return (FT_Fixed *)0x0;
}

Assistant:

static FT_Fixed*
  ft_var_readpackeddeltas( FT_Stream  stream,
                           FT_ULong   size,
                           FT_UInt    delta_cnt )
  {
    FT_Fixed  *deltas = NULL;
    FT_UInt    runcnt, cnt;
    FT_UInt    i, j;
    FT_UInt    bytes_used;
    FT_Memory  memory = stream->memory;
    FT_Error   error;


    if ( FT_QNEW_ARRAY( deltas, delta_cnt ) )
      return NULL;

    i          = 0;
    bytes_used = 0;

    while ( i < delta_cnt && bytes_used < size )
    {
      runcnt = FT_GET_BYTE();
      cnt    = runcnt & GX_DT_DELTA_RUN_COUNT_MASK;

      bytes_used++;

      if ( runcnt & GX_DT_DELTAS_ARE_ZERO )
      {
        /* `cnt` + 1 zeroes get added */
        for ( j = 0; j <= cnt && i < delta_cnt; j++ )
          deltas[i++] = 0;
      }
      else if ( runcnt & GX_DT_DELTAS_ARE_WORDS )
      {
        /* `cnt` + 1 shorts from the stack */
        bytes_used += 2 * ( cnt + 1 );
        if ( bytes_used > size )
        {
          FT_TRACE1(( "ft_var_readpackeddeltas:"
                      " number of short deltas too large\n" ));
          goto Fail;
        }

        for ( j = 0; j <= cnt && i < delta_cnt; j++ )
          deltas[i++] = FT_intToFixed( FT_GET_SHORT() );
      }
      else
      {
        /* `cnt` + 1 signed bytes from the stack */
        bytes_used += cnt + 1;
        if ( bytes_used > size )
        {
          FT_TRACE1(( "ft_var_readpackeddeltas:"
                      " number of byte deltas too large\n" ));
          goto Fail;
        }

        for ( j = 0; j <= cnt && i < delta_cnt; j++ )
          deltas[i++] = FT_intToFixed( FT_GET_CHAR() );
      }

      if ( j <= cnt )
      {
        FT_TRACE1(( "ft_var_readpackeddeltas:"
                    " number of deltas too large\n" ));
        goto Fail;
      }
    }

    if ( i < delta_cnt )
    {
      FT_TRACE1(( "ft_var_readpackeddeltas: not enough deltas\n" ));
      goto Fail;
    }

    return deltas;

  Fail:
    FT_FREE( deltas );
    return NULL;
  }